

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O3

void bake_insert_uni_query_db(char *table_name,int field_count,char **query)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *__s;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  
  sVar4 = strlen(table_name);
  uVar1 = (int)sVar4 + 0x18;
  if (0 < field_count) {
    uVar5 = field_count + 3U & 0xfffffffc;
    uVar18 = field_count - 1;
    uVar19 = 0;
    uVar20 = 1;
    uVar21 = 2;
    uVar22 = 3;
    uVar9 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      uVar12 = uVar13;
      uVar10 = uVar11;
      uVar8 = uVar9;
      uVar7 = uVar1;
      uVar14 = uVar19 ^ 0x80000000;
      uVar15 = uVar20 ^ 0x80000000;
      uVar16 = uVar21 ^ 0x80000000;
      uVar17 = uVar22 ^ 0x80000000;
      uVar1 = uVar7 + (-0x7ffffff7 < (int)uVar14) + 4;
      uVar9 = uVar8 + (-0x7ffffff7 < (int)uVar15) + 4;
      uVar11 = uVar10 + (-0x7ffffff7 < (int)uVar16) + 4;
      uVar13 = uVar12 + (-0x7ffffff7 < (int)uVar17) + 4;
      uVar19 = uVar19 + 4;
      uVar20 = uVar20 + 4;
      uVar21 = uVar21 + 4;
      uVar22 = uVar22 + 4;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
    uVar5 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)uVar14);
    uVar19 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)uVar15);
    uVar20 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)uVar16);
    uVar18 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)uVar17);
    uVar1 = (~uVar18 & uVar13 | uVar12 & uVar18) + (~uVar19 & uVar9 | uVar8 & uVar19) +
            (~uVar20 & uVar11 | uVar10 & uVar20) + (~uVar5 & uVar1 | uVar7 & uVar5);
  }
  sVar4 = (size_t)(int)uVar1;
  __s = (char *)malloc(sVar4);
  *query = __s;
  if (__s != (char *)0x0) {
    iVar2 = snprintf(__s,sVar4,"%s%s%s","INSERT INTO ",table_name," VALUES (");
    if (1 < field_count) {
      uVar6 = 1;
      do {
        iVar3 = snprintf(*query + iVar2,sVar4,"?%i, ",uVar6);
        iVar2 = iVar2 + iVar3;
        uVar1 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar1;
      } while (field_count != uVar1);
    }
    iVar3 = snprintf(*query + iVar2,sVar4,"?%i ",(ulong)(uint)field_count);
    snprintf(*query + (iVar2 + iVar3),sVar4,"%s",");");
    return;
  }
  return;
}

Assistant:

void bake_insert_uni_query_db(const char *table_name, int field_count, char **query) {
    char *query_beginning = "INSERT INTO ";
    char *query_middle = " VALUES (";
    char *query_ending = ");";

    int sql_insert_query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        sql_insert_query_length += 4 + ((i > 9) ? 1 : 0);


    *query = malloc(sql_insert_query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, sql_insert_query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i, ", i + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i ", field_count - 1 + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "%s", query_ending);
}